

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_mass_healing(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  CHAR_DATA *bch;
  bool bVar1;
  CHAR_DATA *pCVar2;
  int sn_00;
  CHAR_DATA **ppCVar4;
  CHAR_DATA *pCVar3;
  
  skill_lookup("heal");
  skill_lookup("refresh");
  ppCVar4 = &ch->in_room->people;
  while (bch = *ppCVar4, bch != (CHAR_DATA *)0x0) {
    pCVar2 = bch;
    pCVar3 = ch;
    bVar1 = is_same_group(ch,bch);
    sn_00 = (int)pCVar3;
    if (bVar1) {
      spell_heal(sn_00,(int)pCVar2,ch,bch,target);
      spell_refresh(sn_00,level,ch,bch,target);
    }
    ppCVar4 = &bch->next_in_room;
  }
  return;
}

Assistant:

void spell_mass_healing(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *gch;
	int heal_num, refresh_num;

	heal_num = skill_lookup("heal");
	refresh_num = skill_lookup("refresh");

	for (gch = ch->in_room->people; gch != nullptr; gch = gch->next_in_room)
	{
		if (is_same_group(ch, gch))
		{
			spell_heal(heal_num, level, ch, (void *)gch, TARGET_CHAR);
			spell_refresh(refresh_num, level, ch, (void *)gch, TARGET_CHAR);
		}
	}
}